

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.c
# Opt level: O2

XXH64_hash_t XXH64(void *input,size_t len,unsigned_long_long seed)

{
  uint *puVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  puVar1 = (uint *)((long)input + len);
  if (len < 0x20) {
    lVar2 = seed + 0x27d4eb2f165667c5;
  }
  else {
    lVar2 = seed + 0x60ea27eeadc0b5d6;
    uVar5 = seed + 0xc2b2ae3d27d4eb4f;
    uVar4 = seed + 0x61c8864e7a143579;
    do {
      uVar7 = *input * -0x3d4d51c2d82b14b1 + lVar2;
      uVar8 = uVar7 * 0x80000000 | uVar7 >> 0x21;
      lVar2 = uVar8 * -0x61c8864e7a143579;
      uVar5 = *(long *)((long)input + 8) * -0x3d4d51c2d82b14b1 + uVar5;
      uVar6 = uVar5 * 0x80000000 | uVar5 >> 0x21;
      uVar5 = *(long *)((long)input + 0x10) * -0x3d4d51c2d82b14b1 + seed;
      uVar7 = uVar5 * 0x80000000 | uVar5 >> 0x21;
      uVar5 = uVar6 * -0x61c8864e7a143579;
      seed = uVar7 * -0x61c8864e7a143579;
      uVar4 = *(long *)((long)input + 0x18) * -0x3d4d51c2d82b14b1 + uVar4;
      uVar3 = uVar4 * 0x80000000 | uVar4 >> 0x21;
      uVar4 = uVar3 * -0x61c8864e7a143579;
      input = (void *)((long)input + 0x20);
    } while (input <= puVar1 + -8);
    lVar2 = ((uVar3 * -0x784349ab80000000 | uVar3 * -0x210ca4fef0869357 >> 0x21) *
             -0x61c8864e7a143579 ^
            ((uVar7 * -0x784349ab80000000 | uVar7 * -0x210ca4fef0869357 >> 0x21) *
             -0x61c8864e7a143579 ^
            ((uVar6 * -0x784349ab80000000 | uVar6 * -0x210ca4fef0869357 >> 0x21) *
             -0x61c8864e7a143579 ^
            ((uVar8 * -0x784349ab80000000 | uVar8 * -0x210ca4fef0869357 >> 0x21) *
             -0x61c8864e7a143579 ^
            (uVar3 * -0x1939e850d5e40000 | uVar4 >> 0x2e) +
            (uVar7 * 0x779b185ebca87000 | seed >> 0x34) +
            (uVar6 * 0x1bbcd8c2f5e54380 | uVar5 >> 0x39) +
            (uVar8 * 0x3c6ef3630bd7950e | (ulong)(lVar2 < 0))) * -0x61c8864e7a143579 +
            0x85ebca77c2b2ae63) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63) * -0x61c8864e7a143579 +
            0x85ebca77c2b2ae63) * -0x61c8864e7a143579 + -0x7a1435883d4d519d;
  }
  uVar5 = lVar2 + len;
  while ((uint *)((long)input + 8) <= puVar1) {
    uVar5 = (*input * -0x6c158a5880000000 | (ulong)(*input * -0x3d4d51c2d82b14b1) >> 0x21) *
            -0x61c8864e7a143579 ^ uVar5;
    uVar5 = (uVar5 << 0x1b | uVar5 >> 0x25) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63;
    input = (uint *)((long)input + 8);
  }
  if ((uint *)((long)input + 4) <= puVar1) {
    uVar5 = (ulong)*input * -0x61c8864e7a143579 ^ uVar5;
    uVar5 = (uVar5 << 0x17 | uVar5 >> 0x29) * -0x3d4d51c2d82b14b1 + 0x165667b19e3779f9;
    input = (uint *)((long)input + 4);
  }
  for (; input < puVar1; input = (uint *)((long)input + 1)) {
    uVar5 = (ulong)(byte)*input * 0x27d4eb2f165667c5 ^ uVar5;
    uVar5 = (uVar5 << 0xb | uVar5 >> 0x35) * -0x61c8864e7a143579;
  }
  uVar5 = (uVar5 >> 0x21 ^ uVar5) * -0x3d4d51c2d82b14b1;
  uVar5 = (uVar5 >> 0x1d ^ uVar5) * 0x165667b19e3779f9;
  return uVar5 >> 0x20 ^ uVar5;
}

Assistant:

XXH_PUBLIC_API unsigned long long XXH64 (const void* input, size_t len, unsigned long long seed)
{
#if 0
    /* Simple version, good for code maintenance, but unfortunately slow for small inputs */
    XXH64_CREATESTATE_STATIC(state);
    XXH64_reset(state, seed);
    XXH64_update(state, input, len);
    return XXH64_digest(state);
#else
    XXH_endianess endian_detected = (XXH_endianess)XXH_CPU_LITTLE_ENDIAN;

    if (XXH_FORCE_ALIGN_CHECK) {
        if ((((size_t)input) & 7)==0) {  /* Input is aligned, let's leverage the speed advantage */
            if ((endian_detected==XXH_littleEndian) || XXH_FORCE_NATIVE_FORMAT)
                return XXH64_endian_align(input, len, seed, XXH_littleEndian, XXH_aligned);
            else
                return XXH64_endian_align(input, len, seed, XXH_bigEndian, XXH_aligned);
    }   }

    if ((endian_detected==XXH_littleEndian) || XXH_FORCE_NATIVE_FORMAT)
        return XXH64_endian_align(input, len, seed, XXH_littleEndian, XXH_unaligned);
    else
        return XXH64_endian_align(input, len, seed, XXH_bigEndian, XXH_unaligned);
#endif
}